

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

FDoomEdEntry * __thiscall
TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Insert
          (TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_> *this,int key,
          FDoomEdEntry *value)

{
  PClassActor *pPVar1;
  undefined8 uVar2;
  short sVar3;
  char cVar4;
  undefined1 uVar5;
  int iVar6;
  Node *pNVar7;
  Node *pNVar8;
  
  pNVar7 = this->Nodes + (this->Size - 1 & key);
  while ((pNVar8 = pNVar7, pNVar8 != (Node *)0x0 && (pNVar8->Next != (Node *)0x1))) {
    pNVar7 = pNVar8->Next;
    if ((pNVar8->Pair).Key == key) {
LAB_00388687:
      pPVar1 = value->Type;
      sVar3 = value->Special;
      cVar4 = value->ArgsDefined;
      uVar5 = value->field_0xb;
      iVar6 = value->Args[0];
      uVar2 = *(undefined8 *)(value->Args + 3);
      *(undefined8 *)((pNVar8->Pair).Value.Args + 1) = *(undefined8 *)(value->Args + 1);
      *(undefined8 *)((pNVar8->Pair).Value.Args + 3) = uVar2;
      (pNVar8->Pair).Value.Type = pPVar1;
      (pNVar8->Pair).Value.Special = sVar3;
      (pNVar8->Pair).Value.ArgsDefined = cVar4;
      (pNVar8->Pair).Value.field_0xb = uVar5;
      (pNVar8->Pair).Value.Args[0] = iVar6;
      return &(pNVar8->Pair).Value;
    }
  }
  pNVar8 = NewKey(this,key);
  goto LAB_00388687;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}